

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O3

int CloseFiles(Context *context,int success)

{
  char *__file;
  int iVar1;
  FILE *__stream;
  uint uVar2;
  bool bVar3;
  stat statbuf;
  utimbuf local_c0;
  stat local_b0;
  
  uVar2 = 1;
  if ((context->test_integrity == 0) && (__stream = (FILE *)context->fout, __stream != (FILE *)0x0))
  {
    if ((success == 0) && (context->current_output_path != (char *)0x0)) {
      unlink(context->current_output_path);
      __stream = (FILE *)context->fout;
    }
    iVar1 = fclose(__stream);
    if (iVar1 == 0 || success == 0) {
      if (success == 0 || iVar1 != 0) {
        uVar2 = (uint)(iVar1 == 0);
      }
      else if (context->copy_stat != 0) {
        __file = context->current_output_path;
        if ((__file != (char *)0x0 && context->current_input_path != (char *)0x0) &&
           (iVar1 = stat(context->current_input_path,&local_b0), iVar1 == 0)) {
          local_c0.actime = local_b0.st_atim.tv_sec;
          local_c0.modtime = local_b0.st_mtim.tv_sec;
          utime(__file,&local_c0);
          iVar1 = chmod(__file,local_b0.st_mode & 0x1ff);
          if (iVar1 != 0) {
            CloseFiles_cold_2();
          }
          iVar1 = chown(__file,0xffffffff,local_b0.st_gid);
          if (iVar1 != 0) {
            CloseFiles_cold_3();
          }
          iVar1 = chown(__file,local_b0.st_uid,0xffffffff);
          if (iVar1 != 0) {
            CloseFiles_cold_4();
          }
        }
      }
    }
    else {
      CloseFiles_cold_1();
      uVar2 = 0;
    }
  }
  if ((((FILE *)context->fin != (FILE *)0x0) && (iVar1 = fclose((FILE *)context->fin), iVar1 != 0))
     && (bVar3 = uVar2 != 0, uVar2 = 0, bVar3)) {
    CloseFiles_cold_5();
  }
  if (((success != 0) && (context->junk_source != 0)) &&
     (context->current_input_path != (char *)0x0)) {
    unlink(context->current_input_path);
  }
  context->fin = (FILE *)0x0;
  context->fout = (FILE *)0x0;
  return uVar2;
}

Assistant:

static BROTLI_BOOL CloseFiles(Context* context, BROTLI_BOOL success) {
  BROTLI_BOOL is_ok = BROTLI_TRUE;
  if (!context->test_integrity && context->fout) {
    if (!success && context->current_output_path) {
      unlink(context->current_output_path);
    }
    if (fclose(context->fout) != 0) {
      if (success) {
        fprintf(stderr, "fclose failed [%s]: %s\n",
                PrintablePath(context->current_output_path), strerror(errno));
      }
      is_ok = BROTLI_FALSE;
    }

    /* TOCTOU violation, but otherwise it is impossible to set file times. */
    if (success && is_ok && context->copy_stat) {
      CopyStat(context->current_input_path, context->current_output_path);
    }
  }

  if (context->fin) {
    if (fclose(context->fin) != 0) {
      if (is_ok) {
        fprintf(stderr, "fclose failed [%s]: %s\n",
                PrintablePath(context->current_input_path), strerror(errno));
      }
      is_ok = BROTLI_FALSE;
    }
  }
  if (success && context->junk_source && context->current_input_path) {
    unlink(context->current_input_path);
  }

  context->fin = NULL;
  context->fout = NULL;

  return is_ok;
}